

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int refs2id(refs_t *r,SAM_hdr *h)

{
  kh_refs_t *h_00;
  kh_cstr_t key;
  khint_t kVar1;
  ref_entry **pprVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  free(r->ref_id);
  if (r->last != (ref_entry *)0x0) {
    r->last = (ref_entry *)0x0;
  }
  iVar4 = h->nref;
  pprVar2 = (ref_entry **)calloc((long)iVar4,8);
  r->ref_id = pprVar2;
  if (pprVar2 == (ref_entry **)0x0) {
    iVar4 = -1;
  }
  else {
    r->nref = iVar4;
    lVar5 = 0;
    for (lVar3 = 0; lVar3 < iVar4; lVar3 = lVar3 + 1) {
      h_00 = r->h_meta;
      key = *(kh_cstr_t *)((long)&h->ref->name + lVar5 * 4);
      kVar1 = kh_get_refs(h_00,key);
      if (kVar1 == h_00->n_buckets) {
        fprintf(_stderr,"Unable to find ref name \'%s\'\n",key);
        iVar4 = h->nref;
      }
      else {
        *(ref_entry **)((long)r->ref_id + lVar5) = h_00->vals[kVar1];
      }
      lVar5 = lVar5 + 8;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int refs2id(refs_t *r, SAM_hdr *h) {
    int i;

    if (r->ref_id)
	free(r->ref_id);
    if (r->last)
	r->last = NULL;

    r->ref_id = calloc(h->nref, sizeof(*r->ref_id));
    if (!r->ref_id)
	return -1;

    r->nref = h->nref;
    for (i = 0; i < h->nref; i++) {
	khint_t k = kh_get(refs, r->h_meta, h->ref[i].name);
	if (k != kh_end(r->h_meta)) {
	    r->ref_id[i] = kh_val(r->h_meta, k);
	} else {
	    fprintf(stderr, "Unable to find ref name '%s'\n",
		    h->ref[i].name);
	}
    }

    return 0;
}